

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

value_type __thiscall my_crc_basic::checksum(my_crc_basic *this)

{
  my_crc_basic *in_RDI;
  uint local_14;
  
  if ((in_RDI->rft_out_ & 1U) == 0) {
    local_14 = in_RDI->rem_;
  }
  else {
    local_14 = reflect(in_RDI,in_RDI->rem_);
  }
  return (local_14 ^ in_RDI->final_) & in_RDI->sig_bits;
}

Assistant:

my_crc_basic::value_type my_crc_basic::checksum() const {
  return ( (rft_out_ ? reflect( rem_ ) : rem_)
	   ^ final_ ) & sig_bits;
}